

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O2

string * __thiscall
nkt::http::response::to_string_abi_cxx11_(string *__return_storage_ptr__,response *this)

{
  ostream *poVar1;
  __node_base *p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  ostringstream result;
  undefined1 local_1e8 [64];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"HTTP/1.0 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_status_code);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&this->_status_message);
  std::operator<<(poVar1,"\r\n");
  p_Var2 = &(this->_headers)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_1e8,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(p_Var2 + 1));
    poVar1 = std::operator<<((ostream *)local_1a8,(string *)local_1e8);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,(string *)(local_1e8 + 0x20));
    std::operator<<(poVar1,"\r\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_1e8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"\r\n");
  std::operator<<(poVar1,(string *)&this->_body);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() {
        std::ostringstream result;
        result << "HTTP/1.0 " << _status_code << " " << _status_message << "\r\n";
        for (auto it : _headers) {
            result << it.first << ": " << it.second << "\r\n";
        }
        result << "\r\n" << _body;
        return result.str();
    }